

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,string *base64)

{
  ByteData local_30;
  string *local_18;
  string *base64_local;
  Psbt *this_local;
  
  local_18 = base64;
  base64_local = (string *)this;
  CryptoUtil::DecodeBase64(&local_30,(string *)base64);
  Psbt(this,&local_30);
  ByteData::~ByteData(&local_30);
  return;
}

Assistant:

Psbt::Psbt(const std::string &base64)
    : Psbt(CryptoUtil::DecodeBase64(base64)) {
  // do nothing
}